

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O2

void __thiscall read_wallmark::operator()(read_wallmark *this,wm_object *wm,xr_reader *r)

{
  uint8_t *puVar1;
  float *pfVar2;
  uint *puVar3;
  
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 1;
  wm->selected = *puVar1 != '\0';
  xray_re::xr_reader::r_fvector3(r,(fvector3 *)&wm->bbox);
  xray_re::xr_reader::r_fvector3(r,&(wm->bbox).field_0.field_0.max);
  xray_re::xr_reader::r_fvector3(r,&(wm->bsphere).p);
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bsphere).r = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  wm->width = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  wm->height = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  wm->rotate = *pfVar2;
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  xray_re::xr_reader::r_seq<std::vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>>>
            (r,(ulong)*puVar3,&wm->vertices);
  return;
}

Assistant:

void operator()(wm_object& wm, xr_reader& r) const {
	wm.selected = r.r_bool();
	r.r_fvector3(wm.bbox.min);
	r.r_fvector3(wm.bbox.max);
	r.r_fvector3(wm.bsphere.p);
	wm.bsphere.r = r.r_float();
	wm.width = r.r_float();
	wm.height = r.r_float();
	wm.rotate = r.r_float();
	r.r_seq(r.r_u32(), wm.vertices);
}